

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::WriteBins(BamStandardIndex *this,int *refId,BaiBinMap *bins)

{
  bool bVar1;
  size_type sVar2;
  long lVar3;
  undefined8 uVar4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>
  *in_RSI;
  long in_RDI;
  iterator binEnd;
  iterator binIter;
  int64_t numBytesWritten;
  int32_t binCount;
  map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
  *in_stack_ffffffffffffff38;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>
  *this_00;
  int *in_stack_ffffffffffffff48;
  allocator *paVar5;
  BamStandardIndex *in_stack_ffffffffffffff50;
  _Self local_98;
  _Self in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 uVar6;
  allocator in_stack_ffffffffffffff7f;
  BamException *in_stack_ffffffffffffff80;
  allocator local_49;
  string local_48 [8];
  BaiAlignmentChunkVector *in_stack_ffffffffffffffc0;
  uint32_t *in_stack_ffffffffffffffc8;
  BamStandardIndex *in_stack_ffffffffffffffd0;
  int32_t local_1c [3];
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  sVar2 = std::
          map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
          ::size((map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                  *)0x28fdb9);
  local_1c[0] = (int32_t)sVar2;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(local_1c);
  }
  lVar3 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x40))(*(long **)(in_RDI + 0x58),local_1c,4);
  if (lVar3 != 4) {
    uVar6 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"BamStandardIndex::WriteBins",&local_49);
    paVar5 = (allocator *)&stack0xffffffffffffff7f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff80,"could not write bin count",paVar5);
    BamException::BamException
              (in_stack_ffffffffffffff80,
               (string *)
               CONCAT17(in_stack_ffffffffffffff7f,
                        CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                                )),(string *)in_stack_ffffffffffffff70._M_node);
    __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
  }
  std::
  map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
  ::size((map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
          *)0x28ff39);
  SaveBinsSummary(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(int *)local_10);
  std::
  map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
  ::begin(in_stack_ffffffffffffff38);
  local_98._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
       ::end(in_stack_ffffffffffffff38);
  this_00 = local_10;
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff70,&local_98);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>
                 *)0x28ff94);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>
                 *)0x28ffa2);
    WriteBin(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>
    ::operator++(this_00);
  }
  return;
}

Assistant:

void BamStandardIndex::WriteBins(const int& refId, BaiBinMap& bins)
{

    // write number of bins
    int32_t binCount = bins.size();
    if (m_isBigEndian) SwapEndian_32(binCount);
    const int64_t numBytesWritten =
        m_resources.Device->Write((const char*)&binCount, sizeof(binCount));
    if (numBytesWritten != sizeof(binCount))
        throw BamException("BamStandardIndex::WriteBins", "could not write bin count");

    // save summary for reference's bins
    SaveBinsSummary(refId, bins.size());

    // iterate over bins
    BaiBinMap::iterator binIter = bins.begin();
    BaiBinMap::iterator binEnd = bins.end();
    for (; binIter != binEnd; ++binIter)
        WriteBin((*binIter).first, (*binIter).second);
}